

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall
t_ocaml_generator::generate_ocaml_struct_member
          (t_ocaml_generator *this,ostream *out,string *tname,t_field *tmember)

{
  t_const_value *ptVar1;
  ostream *poVar2;
  string mname;
  string x;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"_x",(allocator *)&local_d0);
  t_generator::tmp(&local_90,(t_generator *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_70,(string *)&tmember->name_);
  t_generator::decapitalize(&local_d0,(t_generator *)this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"val mutable _");
  poVar2 = std::operator<<(poVar2,(string *)&local_d0);
  poVar2 = std::operator<<(poVar2," : ");
  render_ocaml_type_abi_cxx11_(&local_b0,this,tmember->type_);
  std::operator<<(poVar2,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  ptVar1 = tmember->value_;
  if (ptVar1 == (t_const_value *)0x0) {
    poVar2 = std::operator<<(out," option = None");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar2 = std::operator<<(out," = ");
    render_const_value_abi_cxx11_(&local_b0,this,tmember->type_,tmember->value_);
    poVar2 = std::operator<<(poVar2,(string *)&local_b0);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if (tmember->value_ == (t_const_value *)0x0) {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"method get_");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    poVar2 = std::operator<<(poVar2," = _");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"method grab_");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    poVar2 = std::operator<<(poVar2," = match _");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    poVar2 = std::operator<<(poVar2," with None->raise (Field_empty \"");
    poVar2 = std::operator<<(poVar2,(string *)tname);
    poVar2 = std::operator<<(poVar2,".");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    poVar2 = std::operator<<(poVar2,"\") | Some ");
    poVar2 = std::operator<<(poVar2,(string *)&local_90);
    poVar2 = std::operator<<(poVar2," -> ");
    poVar2 = std::operator<<(poVar2,(string *)&local_90);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"method set_");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,(string *)&local_90);
    poVar2 = std::operator<<(poVar2," = _");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    poVar2 = std::operator<<(poVar2," <- Some ");
    poVar2 = std::operator<<(poVar2,(string *)&local_90);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"method unset_");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    poVar2 = std::operator<<(poVar2," = _");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    poVar2 = std::operator<<(poVar2," <- None");
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"method get_");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    poVar2 = std::operator<<(poVar2," = Some _");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"method grab_");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    poVar2 = std::operator<<(poVar2," = _");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"method set_");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,(string *)&local_90);
    poVar2 = std::operator<<(poVar2," = _");
    poVar2 = std::operator<<(poVar2,(string *)&local_d0);
    poVar2 = std::operator<<(poVar2," <- ");
    poVar2 = std::operator<<(poVar2,(string *)&local_90);
  }
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"method reset_");
  poVar2 = std::operator<<(poVar2,(string *)&local_d0);
  poVar2 = std::operator<<(poVar2," = _");
  poVar2 = std::operator<<(poVar2,(string *)&local_d0);
  std::operator<<(poVar2," <- ");
  if (ptVar1 == (t_const_value *)0x0) {
    poVar2 = std::operator<<(out,"None");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  else {
    if (tmember->value_ == (t_const_value *)0x0) {
      poVar2 = std::operator<<(out,"Some ");
      render_const_value_abi_cxx11_(&local_b0,this,tmember->type_,tmember->value_);
      poVar2 = std::operator<<(poVar2,(string *)&local_b0);
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    }
    else {
      render_const_value_abi_cxx11_(&local_b0,this,tmember->type_,tmember->value_);
      poVar2 = std::operator<<(out,(string *)&local_b0);
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_struct_member(ostream& out,
                                                     string tname,
                                                     t_field* tmember) {
  string x = tmp("_x");
  string mname = decapitalize(tmember->get_name());

  indent(out) << "val mutable _" << mname << " : " << render_ocaml_type(tmember->get_type());
  t_const_value* val = tmember->get_value();
  if (val) {
    if (struct_member_persistent(tmember))
      out << " = " << render_const_value(tmember->get_type(), tmember->get_value()) << endl;
    else
      out << " option = Some " << render_const_value(tmember->get_type(), tmember->get_value())
          << endl;
  } else {
    // assert(!struct_member_persistent(tmember))
    out << " option = None" << endl;
  }

  if (struct_member_persistent(tmember)) {
    indent(out) << "method get_" << mname << " = Some _" << mname << endl;
    indent(out) << "method grab_" << mname << " = _" << mname << endl;
    indent(out) << "method set_" << mname << " " << x << " = _" << mname << " <- " << x << endl;
  } else {
    indent(out) << "method get_" << mname << " = _" << mname << endl;
    indent(out) << "method grab_" << mname << " = match _" << mname
                << " with None->raise (Field_empty \"" << tname << "." << mname << "\") | Some "
                << x << " -> " << x << endl;
    indent(out) << "method set_" << mname << " " << x << " = _" << mname << " <- Some " << x
                << endl;
    indent(out) << "method unset_" << mname << " = _" << mname << " <- None" << endl;
  }

  indent(out) << "method reset_" << mname << " = _" << mname << " <- ";
  if (val) {
    if (struct_member_persistent(tmember))
      out << render_const_value(tmember->get_type(), tmember->get_value()) << endl;
    else
      out << "Some " << render_const_value(tmember->get_type(), tmember->get_value()) << endl;
  } else {
    out << "None" << endl;
  }
}